

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O2

void __thiscall JPG::discreteCosineTransform(JPG *this)

{
  uint uVar1;
  MCU *pMVar2;
  Block *padVar3;
  uint uVar4;
  uint uVar5;
  Block **ppadVar6;
  uint uVar7;
  double *pdVar8;
  uint uVar9;
  long lVar10;
  uint componentID;
  uint ID;
  uint x;
  long lVar11;
  uint ii;
  uint uVar12;
  uint jj;
  uint uVar13;
  
  for (uVar7 = 0; uVar7 < this->mcuHeight; uVar7 = uVar7 + 1) {
    uVar9 = 0;
    while( true ) {
      uVar1 = this->mcuWidth;
      if (uVar1 <= uVar9) break;
      pMVar2 = this->data;
      for (ID = 1; ID != 4; ID = ID + 1) {
        uVar12 = 0;
        while( true ) {
          uVar4 = getVerticalSamplingFrequency(this,ID);
          if (uVar4 <= uVar12) break;
          uVar13 = 0;
          while( true ) {
            uVar4 = getHorizontalSamplingFrequency(this,ID);
            if (uVar4 <= uVar13) break;
            ppadVar6 = MCU::operator[](pMVar2 + (uVar1 * uVar7 + uVar9),ID);
            padVar3 = *ppadVar6;
            uVar4 = getHorizontalSamplingFrequency(this,ID);
            uVar5 = uVar4 * uVar12 + uVar13;
            pdVar8 = padVar3[uVar5];
            for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
              for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
                pdVar8[lVar11] = pdVar8[lVar11] + -128.0;
              }
              pdVar8 = pdVar8 + 8;
            }
            DCT(padVar3 + uVar5);
            uVar13 = uVar13 + 1;
          }
          uVar12 = uVar12 + 1;
        }
      }
      uVar9 = uVar9 + 1;
    }
  }
  return;
}

Assistant:

void JPG::discreteCosineTransform() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        //在进行DCT变化之前把0~255变化到-128~127
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                currentBlock[y * 8 + x] = currentBlock[y * 8 + x] - 128.0;
                            }
                        }
                        DCT(currentBlock); 
                    }
                }             
            }
        }
    }  
}